

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall QHttpNetworkRequest::setOperation(QHttpNetworkRequest *this,Operation operation)

{
  QHttpNetworkRequestPrivate *pQVar1;
  Operation in_ESI;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->operation = in_ESI;
  return;
}

Assistant:

void QHttpNetworkRequest::setOperation(Operation operation)
{
    d->operation = operation;
}